

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpexternaltransmitter.cpp
# Opt level: O3

void __thiscall
jrtplib::RTPExternalTransmitter::InjectRTPorRTCP
          (RTPExternalTransmitter *this,void *data,size_t len,RTPAddress *a)

{
  size_t *psVar1;
  RTPMemoryManager *pRVar2;
  int iVar3;
  undefined4 extraout_var;
  _List_node_base *__dest;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  uint8_t *pData;
  bool bVar6;
  timespec tpMono;
  timespec tpMono_1;
  _List_node_base *local_58;
  timespec local_50;
  timespec local_40;
  
  if ((this->init == true) && (this->created == true)) {
    iVar3 = (**a->_vptr_RTPAddress)(a,(this->super_RTPTransmitter).super_RTPMemoryObject.mgr);
    p_Var5 = (_List_node_base *)CONCAT44(extraout_var,iVar3);
    if (p_Var5 != (_List_node_base *)0x0) {
      if (len < 2) {
        iVar3 = 1;
        bVar6 = true;
      }
      else {
        bVar6 = (byte)(*(char *)((long)data + 1) + 0x33U) < 0xfb;
        iVar3 = 2 - (uint)bVar6;
      }
      pRVar2 = (this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
      if (pRVar2 == (RTPMemoryManager *)0x0) {
        __dest = (_List_node_base *)operator_new__(len);
      }
      else {
        __dest = (_List_node_base *)(**(code **)(*(long *)pRVar2 + 0x10))(pRVar2,len,iVar3);
        if (__dest == (_List_node_base *)0x0) {
          pRVar2 = (this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
          if (pRVar2 != (RTPMemoryManager *)0x0) {
            (*(code *)p_Var5->_M_next[1]._M_prev)(p_Var5);
            (**(code **)(*(long *)pRVar2 + 0x18))(pRVar2,p_Var5);
            return;
          }
          (*(code *)p_Var5->_M_next[2]._M_next)(p_Var5);
          return;
        }
      }
      memcpy(__dest,data,len);
      if (RTPTime::CurrentTime()::s_initialized == '\0') {
        RTPTime::CurrentTime()::s_initialized = '\x01';
        clock_gettime(0,&local_50);
        clock_gettime(1,&local_40);
        local_58 = (_List_node_base *)((double)local_50.tv_nsec * 1e-09 + (double)local_50.tv_sec);
        RTPTime::CurrentTime()::s_startOffet =
             (double)local_58 - ((double)local_40.tv_nsec * 1e-09 + (double)local_40.tv_sec);
      }
      else {
        clock_gettime(1,&local_50);
        local_58 = (_List_node_base *)
                   ((double)local_50.tv_nsec * 1e-09 + (double)local_50.tv_sec +
                   RTPTime::CurrentTime()::s_startOffet);
      }
      pRVar2 = (this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
      if (pRVar2 == (RTPMemoryManager *)0x0) {
        p_Var4 = (_List_node_base *)operator_new(0x38);
      }
      else {
        p_Var4 = (_List_node_base *)(**(code **)(*(long *)pRVar2 + 0x10))(pRVar2,0x38,0x1b);
      }
      p_Var4->_M_prev = (_List_node_base *)(this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
      p_Var4->_M_next = (_List_node_base *)&PTR__RTPRawPacket_0013c060;
      p_Var4[2]._M_next = local_58;
      p_Var4[1]._M_next = __dest;
      p_Var4[1]._M_prev = (_List_node_base *)len;
      p_Var4[2]._M_prev = p_Var5;
      *(bool *)&p_Var4[3]._M_next = bVar6;
      p_Var5 = (_List_node_base *)operator_new(0x18);
      p_Var5[1]._M_next = p_Var4;
      std::__detail::_List_node_base::_M_hook(p_Var5);
      psVar1 = &(this->rawpacketlist).
                super__List_base<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>.
                _M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      if (this->m_abortCount == 0) {
        RTPAbortDescriptors::SendAbortSignal(&this->m_abortDesc);
        this->m_abortCount = this->m_abortCount + 1;
      }
    }
  }
  return;
}

Assistant:

void RTPExternalTransmitter::InjectRTPorRTCP(const void *data, size_t len, const RTPAddress &a)
{
	if (!init)
		return;

	MAINMUTEX_LOCK
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return;
	}

	RTPAddress *addr = a.CreateCopy(GetMemoryManager());
	if (addr == 0)
		return;

	uint8_t *datacopy;
	bool rtp = true;

	if (len >= 2)
	{
		const uint8_t *pData = (const uint8_t *)data;
		if (pData[1] >= 200 && pData[1] <= 204)
			rtp = false;
	}

	datacopy = RTPNew(GetMemoryManager(),(rtp)?RTPMEM_TYPE_BUFFER_RECEIVEDRTPPACKET:RTPMEM_TYPE_BUFFER_RECEIVEDRTCPPACKET) uint8_t[len];
	if (datacopy == 0)
	{
		RTPDelete(addr,GetMemoryManager());
		return;
	}
	memcpy(datacopy, data, len);

	RTPTime curtime = RTPTime::CurrentTime();
	RTPRawPacket *pack;

	pack = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPRAWPACKET) RTPRawPacket(datacopy,len,addr,curtime,rtp,GetMemoryManager());
	if (pack == 0)
	{
		RTPDelete(addr,GetMemoryManager());
		RTPDeleteByteArray(localhostname,GetMemoryManager());
		return;
	}
	rawpacketlist.push_back(pack);

	if (m_abortCount == 0)
	{
		m_abortDesc.SendAbortSignal();
		m_abortCount++;
	}

	MAINMUTEX_UNLOCK

}